

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

char * __thiscall sznet::net::TcpConnection::stateToString(TcpConnection *this)

{
  char *pcVar1;
  
  if ((ulong)this->m_state < 4) {
    pcVar1 = *(char **)(&DAT_00136b60 + (ulong)this->m_state * 8);
  }
  else {
    pcVar1 = "unknown state";
  }
  return pcVar1;
}

Assistant:

const char* TcpConnection::stateToString() const
{
	switch (m_state)
	{
	case kDisconnected:
		return "kDisconnected";
	case kConnecting:
		return "kConnecting";
	case kConnected:
		return "kConnected";
	case kDisconnecting:
		return "kDisconnecting";
	default:
		return "unknown state";
	}
}